

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenKeyCompare
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  FieldDef *local_38;
  
  if (struct_def->has_key == false) {
    __assert_fail("struct_def.has_key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x3a6,
                  "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  local_38 = field;
  if (field->key != false) {
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_58,pIVar1,struct_def);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x37b48c);
    local_98 = &local_88;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_88 = *plVar3;
      lStack_80 = plVar2[3];
    }
    else {
      local_88 = *plVar3;
      local_98 = (long *)*plVar2;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar2 = &local_68;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar3[3];
      local_78 = plVar2;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_78);
    if (local_78 != plVar2) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_58,pIVar1,struct_def);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c82b);
    local_98 = &local_88;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_88 = *plVar5;
      lStack_80 = plVar3[3];
    }
    else {
      local_88 = *plVar5;
      local_98 = (long *)*plVar3;
    }
    local_90 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar3[3];
      local_78 = plVar2;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_78);
    if (local_78 != plVar2) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_58,pIVar1,struct_def);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c836);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_88 = *plVar5;
      lStack_80 = plVar3[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar5;
      local_98 = (long *)*plVar3;
    }
    local_90 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar3[3];
      local_78 = plVar2;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_78);
    if (local_78 != plVar2) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    if ((local_38->value).type.base_type == BASE_TYPE_STRING) {
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_58,pIVar1,local_38,(ulong)(this->namer_).super_Namer.config_.functions);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c8a9);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_88 = *plVar3;
        lStack_80 = plVar2[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar3;
        local_98 = (long *)*plVar2;
      }
      local_90 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar2 = &local_68;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar3[3];
        local_78 = plVar2;
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_78);
      if (local_78 != plVar2) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_58,pIVar1,local_38,(ulong)(this->namer_).super_Namer.config_.functions);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c8c5);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_88 = *plVar5;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar5;
        local_98 = (long *)*plVar3;
      }
      local_90 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar3[3];
      }
      else {
        local_68 = *plVar5;
        plVar2 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_78 = plVar2;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)plVar2);
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_58,pIVar1,local_38,(ulong)(this->namer_).super_Namer.config_.functions);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c8d2);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_88 = *plVar5;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar5;
        local_98 = (long *)*plVar3;
      }
      local_90 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar3[3];
        local_78 = plVar2;
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_78);
      if (local_78 != plVar2) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_58,pIVar1,local_38,(ulong)(this->namer_).super_Namer.config_.functions);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36c8cc);
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_88 = *plVar3;
        lStack_80 = puVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar3;
        local_98 = (long *)*puVar4;
      }
      local_90 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar3[3];
      }
      else {
        local_68 = *plVar5;
        plVar2 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_78 = plVar2;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)plVar2);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    return;
  }
  __assert_fail("field.key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                ,0x3a7,
                "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
               );
}

Assistant:

void GenKeyCompare(const StructDef &struct_def, const FieldDef &field,
                     std::string *code_ptr) {
    FLATBUFFERS_ASSERT(struct_def.has_key);
    FLATBUFFERS_ASSERT(field.key);
    std::string &code = *code_ptr;

    code += "func " + namer_.Type(struct_def) + "KeyCompare(";
    code += "o1, o2 flatbuffers.UOffsetT, buf []byte) bool {\n";
    code += "\tobj1 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj2 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj1.Init(buf, flatbuffers.UOffsetT(len(buf))-o1)\n";
    code += "\tobj2.Init(buf, flatbuffers.UOffsetT(len(buf))-o2)\n";
    if (IsString(field.value.type)) {
      code += "\treturn string(obj1." + namer_.Function(field.name) + "()) < ";
      code += "string(obj2." + namer_.Function(field.name) + "())\n";
    } else {
      code += "\treturn obj1." + namer_.Function(field.name) + "() < ";
      code += "obj2." + namer_.Function(field.name) + "()\n";
    }
    code += "}\n\n";
  }